

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,i64 *pnChange)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  uint *pCell;
  ulong uVar5;
  MemPage *pPage;
  CellInfo info;
  MemPage *local_50;
  CellInfo local_48;
  
  if (pBt->nPage < pgno) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b7a,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    return 0xb;
  }
  iVar4 = getAndInitPage(pBt,pgno,&local_50,(BtCursor *)0x0,0);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (((pBt->openFlags & 4) == 0) && ((pgno == 1) + 1 != (int)local_50->pDbPage->nRef)) {
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b81,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    goto LAB_001467ef;
  }
  bVar1 = local_50->hdrOffset;
  if (local_50->nCell == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = 0;
    do {
      pCell = (uint *)(local_50->aData +
                      (CONCAT11(local_50->aCellIdx[uVar5 * 2],local_50->aCellIdx[uVar5 * 2 + 1]) &
                      local_50->maskPage));
      if (local_50->leaf == '\0') {
        uVar2 = *pCell;
        iVar4 = clearDatabasePage(pBt,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                      (uVar2 & 0xff00) << 8 | uVar2 << 0x18,1,pnChange);
        if (iVar4 != 0) goto LAB_001467ef;
      }
      (*local_50->xParseCell)(local_50,(u8 *)pCell,&local_48);
      if ((local_48.nPayload != local_48.nLocal) &&
         (iVar4 = clearCellOverflow(local_50,(uchar *)pCell,&local_48), iVar4 != 0))
      goto LAB_001467ef;
      uVar5 = uVar5 + 1;
      uVar3 = local_50->nCell;
    } while (uVar5 < uVar3);
  }
  if (local_50->leaf == '\0') {
    uVar2 = *(uint *)(local_50->aData + (ulong)bVar1 + 8);
    iVar4 = clearDatabasePage(pBt,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                  uVar2 << 0x18,1,pnChange);
    if (iVar4 != 0) goto LAB_001467ef;
    if ((pnChange != (i64 *)0x0) && (local_50->intKey == '\0')) {
      uVar3 = local_50->nCell;
      goto LAB_00146765;
    }
  }
  else if (pnChange != (i64 *)0x0) {
LAB_00146765:
    *pnChange = *pnChange + (ulong)uVar3;
  }
  if (freePageFlag == 0) {
    iVar4 = sqlite3PagerWrite(local_50->pDbPage);
    if (iVar4 == 0) {
      zeroPage(local_50,local_50->aData[bVar1] | 8);
      iVar4 = 0;
    }
  }
  else {
    iVar4 = freePage2(local_50->pBt,local_50,local_50->pgno);
  }
LAB_001467ef:
  sqlite3PagerUnrefNotNull(local_50->pDbPage);
  return iVar4;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  i64 *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( (pBt->openFlags & BTREE_SINGLE)==0
   && sqlite3PagerPageRefcount(pPage->pDbPage) != (1 + (pgno==1))
  ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    BTREE_CLEAR_CELL(rc, pPage, pCell, info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
    if( pPage->intKey ) pnChange = 0;
  }
  if( pnChange ){
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}